

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task12.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int a;
  int local_2c;
  
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  uVar5 = (ulong)local_2c;
  pvVar1 = operator_new__(uVar5);
  if (2 < (long)uVar5) {
    iVar4 = 2;
    do {
      for (iVar3 = iVar4 * 2; iVar3 < (int)uVar5; iVar3 = iVar3 + iVar4) {
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        uVar5 = (ulong)local_2c;
        if (*(char *)((long)pvVar1 + uVar5) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_8ae,0x13);
          goto LAB_001012ad;
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (int)uVar5);
  }
LAB_001012ad:
  operator_delete__(pvVar1);
  return 0;
}

Assistant:

int main(){
    int a;
    bool flag = true;

    cin >> a;

    bool *b = new bool[a];
    for (int i = 2; i < a; i++){
        for (int j = 2*i; j < a; j += i){
            cout << j << endl;
            b[j] == true;
            if (b[a]){
                flag = false;
                cout << "не простое";
                break;
            }
        }
        if (!flag) break;
    }

    delete[] b;
    return 0;
}